

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O0

void __thiscall QPlatformPixmap::~QPlatformPixmap(QPlatformPixmap *this)

{
  undefined8 *in_RDI;
  QPlatformPixmap *unaff_retaddr;
  
  *in_RDI = &PTR__QPlatformPixmap_00e150e8;
  if (*(int *)((long)in_RDI + 0x2c) != 0) {
    QImagePixmapCleanupHooks::executePlatformPixmapDestructionHooks(unaff_retaddr);
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  }
  return;
}

Assistant:

QPlatformPixmap::~QPlatformPixmap()
{
    // Sometimes the pixmap cleanup hooks will be called from derived classes, which will
    // then set is_cached to false. For example, on X11 Qt GUI needs to delete the GLXPixmap
    // or EGL Pixmap Surface for a given pixmap _before_ the native X11 pixmap is deleted,
    // otherwise some drivers will leak the GL surface. In this case, QX11PlatformPixmap will
    // call the cleanup hooks itself before deleting the native pixmap and set is_cached to
    // false.
    if (is_cached) {
        QImagePixmapCleanupHooks::executePlatformPixmapDestructionHooks(this);
        is_cached = false;
    }
}